

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O1

int lj_cdata_get(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  GCcdata *pGVar4;
  void *pvVar5;
  CTypeID id;
  ulong uVar6;
  CType *s_00;
  bool bVar7;
  lua_Number lVar8;
  
  uVar2 = s->info;
  if (uVar2 >> 0x1c == 10) {
    iVar3 = lj_cconv_tv_bf(cts,s,o,sp);
    return iVar3;
  }
  if (uVar2 >> 0x1c == 0xb) {
    if (((*(byte *)((long)&cts->tab->info + (ulong)((uVar2 & 0xffff) << 4) + 2) & 0x80) == 0) ||
       (-1 < (int)s->size)) {
      lVar8 = (lua_Number)(int)s->size;
    }
    else {
      lVar8 = (lua_Number)s->size;
    }
    o->n = lVar8;
    return 0;
  }
  id = uVar2 & 0xffff;
  uVar6 = (ulong)(id << 4);
  uVar2 = *(uint *)((long)&cts->tab->info + uVar6);
  if ((uVar2 & 0xf0800000) == 0x20800000) {
    sp = *(uint8_t **)sp;
    id = uVar2 & 0xffff;
    uVar6 = (ulong)(id << 4);
  }
  s_00 = (CType *)((long)&cts->tab->info + uVar6);
  uVar2 = s_00->info;
  if (uVar2 < 0x10000000) {
    if (0x7ffffff < uVar2) {
      if (s_00->size == 1) {
        bVar7 = (char)*(int *)sp == '\0';
      }
      else {
        bVar7 = *(int *)sp == 0;
      }
      (o->field_2).it = -(uint)!bVar7 - 2;
      (cts->g->tmptv2).field_2.it = -(uint)!bVar7 - 2;
      return 0;
    }
    if ((0x3ffffff < uVar2) || (s_00->size < 5)) {
      lj_cconv_ct_ct(cts,cts->tab + 0xe,s_00,(uint8_t *)&o->u64,sp,0);
      return 0;
    }
  }
  else if ((uVar2 & 0xfc000000) == 0x30000000 || (uVar2 & 0xf0000000) == 0x10000000) {
    pGVar4 = lj_cdata_newref(cts,sp,id);
    (o->u32).lo = (uint32_t)pGVar4;
    (o->field_2).it = 0xfffffff5;
    return 1;
  }
  uVar2 = s_00->size;
  iVar3 = *(int *)&cts->tab;
  pvVar5 = lj_mem_newgco(cts->L,uVar2 + 8);
  *(undefined1 *)((long)pvVar5 + 5) = 10;
  *(short *)((long)pvVar5 + 6) = (short)((uint)((int)s_00 - iVar3) >> 4);
  plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  (o->u32).lo = (uint32_t)pvVar5;
  (o->field_2).it = 0xfffffff5;
  memcpy((void *)((long)pvVar5 + 8),sp,(ulong)uVar2);
  return 1;
}

Assistant:

int lj_cdata_get(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTypeID sid;

  if (ctype_isconstval(s->info)) {
    cdata_getconst(cts, o, s);
    return 0;  /* No GC step needed. */
  } else if (ctype_isbitfield(s->info)) {
    return lj_cconv_tv_bf(cts, s, o, sp);
  }

  /* Get child type of pointer/array/field. */
  lj_assertCTS(ctype_ispointer(s->info) || ctype_isfield(s->info),
	       "pointer or field expected");
  sid = ctype_cid(s->info);
  s = ctype_get(cts, sid);

  /* Resolve reference for field. */
  if (ctype_isref(s->info)) {
    lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
    sp = *(uint8_t **)sp;
    sid = ctype_cid(s->info);
    s = ctype_get(cts, sid);
  }

  /* Skip attributes. */
  while (ctype_isattrib(s->info))
    s = ctype_child(cts, s);

  return lj_cconv_tv_ct(cts, s, sid, o, sp);
}